

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O0

bool EncoderMD::SetsConditionCode(Instr *instr)

{
  bool bVar1;
  uint32 uVar2;
  undefined1 local_11;
  Instr *instr_local;
  
  bVar1 = IR::Instr::IsLowered(instr);
  local_11 = false;
  if (bVar1) {
    uVar2 = GetOpdope(instr);
    local_11 = (uVar2 & 2) != 0;
  }
  return local_11;
}

Assistant:

bool EncoderMD::SetsConditionCode(IR::Instr *instr)
{
    return instr->IsLowered() && (EncoderMD::GetOpdope(instr) & DSETCC);
}